

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.cc
# Opt level: O0

void __thiscall ReportAsync::SendReport(ReportAsync *this,Report *report)

{
  bool bVar1;
  mutex_type *in_RSI;
  queue<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::deque<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *in_RDI;
  lock_guard<std::mutex> lock;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)in_RDI,in_RSI);
  if (((in_RDI->c).
       super__Deque_base<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Deque_impl_data._M_map_size & 1) == 0) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)0x10cb46);
    if (!bVar1) {
      StartThread((ReportAsync *)lock._M_device);
    }
    std::
    queue<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::deque<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::push(in_RDI,(value_type *)in_RSI);
    std::condition_variable::notify_all();
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x10cb9e);
  return;
}

Assistant:

void SendReport(Report report) override {
    std::lock_guard<std::mutex> lock(queue_lock_);
    if (!terminated_) {
      if (!reporter_thread_) {
        StartThread();
      }
      // This assumes that the rate at which SendReport is called does not
      // exceed the rate at which reports can be written, on average. Since that
      // isn't always a safe assumption, it might be helpful to limit the queue
      // size and either wait or drop reports if that limit is exceeded here.
      queue_.push(std::move(report));
      queue_wait_.notify_all();
    }
  }